

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O2

CMimeAddress_T * cmime_address_parse_string(char *s)

{
  CMimeAddress_T *pCVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  ulong __n;
  
  pCVar1 = cmime_address_new();
  sVar2 = strlen(s);
  pcVar3 = strrchr(s,0x3c);
  iVar5 = (int)sVar2;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)calloc((long)iVar5 + 1,1);
    pCVar1->email = pcVar3;
    strncpy(pcVar3,s,(long)iVar5);
    sVar2 = strlen(pcVar3);
    pcVar3[sVar2] = '\0';
  }
  else {
    sVar2 = strlen(pcVar3);
    uVar6 = iVar5 - (int)sVar2;
    if (0 < (int)uVar6) {
      __n = (ulong)(uVar6 & 0x7fffffff);
      pcVar4 = (char *)calloc(__n + 1,1);
      pCVar1->name = pcVar4;
      strncpy(pcVar4,s,__n);
      sVar2 = strlen(pcVar4);
      pcVar4[sVar2] = '\0';
    }
    sVar2 = strlen(pcVar3);
    pcVar4 = (char *)calloc(sVar2 + 1,1);
    pCVar1->email = pcVar4;
    strcpy(pcVar4,pcVar3);
  }
  pCVar1->parsed = 1;
  return pCVar1;
}

Assistant:

CMimeAddress_T *cmime_address_parse_string(const char *s) {
    CMimeAddress_T *ca = cmime_address_new();
    char *t1 = NULL;
    int size_in;
    int offset;

    size_in = strlen(s);
    t1 = strrchr(s,'<');
    if (t1 != NULL) {
        offset = size_in - strlen(t1);

        if (offset > 0) {
            ca->name = (char *)calloc(offset + sizeof(char),sizeof(char));
            strncpy(ca->name,s,offset);
            ca->name[strlen(ca->name)] = '\0';
        }

        ca->email = (char *)calloc(strlen(t1) + sizeof(char),sizeof(char));
        strcpy(ca->email,t1);
    }   else {
        ca->email = (char *)calloc(size_in + sizeof(char),sizeof(char));
        strncpy(ca->email,s,size_in);
        ca->email[strlen(ca->email)] = '\0';
    }

    ca->parsed = 1;
    return(ca);
}